

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteChaptersCueTimings(FILE *f,Chapters *chapters,Atom *atom)

{
  bool bVar1;
  int iVar2;
  longlong time_ns;
  longlong time_ns_00;
  mkvtime_t stop_ns;
  mkvtime_t start_ns;
  Atom *atom_local;
  Chapters *chapters_local;
  FILE *f_local;
  
  time_ns = mkvparser::Chapters::Atom::GetStartTime(atom,chapters);
  if (time_ns < 0) {
    f_local._7_1_ = false;
  }
  else {
    time_ns_00 = mkvparser::Chapters::Atom::GetStopTime(atom,chapters);
    if (time_ns_00 < 0) {
      f_local._7_1_ = false;
    }
    else {
      bVar1 = WriteCueTime(f,time_ns);
      if (bVar1) {
        iVar2 = fputs(" --> ",(FILE *)f);
        if (iVar2 < 0) {
          f_local._7_1_ = false;
        }
        else {
          bVar1 = WriteCueTime(f,time_ns_00);
          if (bVar1) {
            iVar2 = fputc(10,(FILE *)f);
            if (iVar2 < 0) {
              f_local._7_1_ = false;
            }
            else {
              f_local._7_1_ = true;
            }
          }
          else {
            f_local._7_1_ = false;
          }
        }
      }
      else {
        f_local._7_1_ = false;
      }
    }
  }
  return f_local._7_1_;
}

Assistant:

bool vttdemux::WriteChaptersCueTimings(FILE* f,
                                       const mkvparser::Chapters* chapters,
                                       const mkvparser::Chapters::Atom* atom) {
  const mkvtime_t start_ns = atom->GetStartTime(chapters);

  if (start_ns < 0)
    return false;

  const mkvtime_t stop_ns = atom->GetStopTime(chapters);

  if (stop_ns < 0)
    return false;

  if (!WriteCueTime(f, start_ns))
    return false;

  if (fputs(" --> ", f) < 0)
    return false;

  if (!WriteCueTime(f, stop_ns))
    return false;

  if (fputc('\n', f) < 0)
    return false;

  return true;
}